

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> * __thiscall
kj::_::NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>::emplace<>
          (NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_> *this)

{
  if (this->isSet == true) {
    this->isSet = false;
    Table<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Callbacks>_>
    ::~Table(&(this->field_1).value.table);
  }
  (this->field_1).value.table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->field_1).value.table.indexes.buckets.size_ = 0;
  *(undefined8 *)&(this->field_1).value.table.indexes = 0;
  (this->field_1).value.table.indexes.erasedCount = 0;
  (this->field_1).value.table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->field_1).value.table.rows.builder.endPtr = (Entry *)0x0;
  (this->field_1).value.table.rows.builder.disposer = (ArrayDisposer *)0x0;
  (this->field_1).value.table.rows.builder.ptr = (Entry *)0x0;
  (this->field_1).value.table.rows.builder.pos =
       (RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)0x0;
  this->isSet = true;
  return (HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }